

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O3

void __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::link_node
          (KDTree<phosg::Vector2<long>,_long> *this,Node *new_node)

{
  size_t sVar1;
  Node *pNVar2;
  long lVar3;
  KDTree<phosg::Vector2<long>,_long> *pKVar4;
  Node *pNVar5;
  
  pKVar4 = this;
  pNVar2 = this->root;
  if (this->root != (Node *)0x0) {
    do {
      while (pNVar5 = pNVar2, sVar1 = pNVar5->dim,
            (&(new_node->pt).field_0)[sVar1].x < (&(pNVar5->pt).field_0)[sVar1].x) {
        pNVar2 = pNVar5->before;
        if (pNVar5->before == (Node *)0x0) {
          lVar3 = 0x18;
          goto LAB_0010891a;
        }
      }
      pNVar2 = pNVar5->after_or_equal;
    } while (pNVar5->after_or_equal != (Node *)0x0);
    lVar3 = 0x20;
LAB_0010891a:
    pKVar4 = (KDTree<phosg::Vector2<long>,_long> *)((long)&(pNVar5->pt).field_0 + lVar3);
    new_node->dim = (ulong)(~(uint)sVar1 & 1);
    new_node->parent = pNVar5;
  }
  pKVar4->root = new_node;
  this->node_count = this->node_count + 1;
  return;
}

Assistant:

void KDTree<CoordType, ValueType>::link_node(Node* new_node) {
  if (this->root == nullptr) {
    this->root = new_node;
    this->node_count++;
    return;
  }

  Node* n = this->root;
  for (;;) {
    if (new_node->pt.at(n->dim) < n->pt.at(n->dim)) {
      if (n->before == nullptr) {
        new_node->dim = (n->dim + 1) % CoordType::dimensions();
        new_node->parent = n;
        n->before = new_node;
        this->node_count++;
        return;
      } else {
        n = n->before;
      }
    } else {
      if (n->after_or_equal == nullptr) {
        new_node->dim = (n->dim + 1) % CoordType::dimensions();
        new_node->parent = n;
        n->after_or_equal = new_node;
        this->node_count++;
        return;
      } else {
        n = n->after_or_equal;
      }
    }
  }
}